

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O3

void glslang::SpirvToolsTransform
               (TIntermediate *intermediate,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,SpvBuildLogger *logger,
               SpvOptions *options)

{
  uint32_t *puVar1;
  pointer puVar2;
  spv_target_env env;
  spv_optimizer_options options_00;
  Optimizer optimizer2;
  Optimizer optimizer;
  Optimizer local_90;
  Optimizer local_88;
  spv_target_env local_7c;
  PassToken local_78;
  MessageConsumer local_70;
  MessageConsumer local_50;
  
  local_7c = MapToSpirvToolsEnv(&intermediate->spvVersion,logger);
  spvtools::Optimizer::Optimizer(&local_88,local_7c);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = OptimizerMesssageConsumer;
  local_50._M_invoker =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
       ::_M_manager;
  spvtools::Optimizer::SetMessageConsumer(&local_88,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  if (options->stripDebugInfo == true) {
    spvtools::CreateStripDebugInfoPass();
    spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
    spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  }
  spvtools::CreateWrapOpKillPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateDeadBranchElimPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateMergeReturnPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateInlineExhaustivePass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateEliminateDeadFunctionsPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateScalarReplacementPass((spvtools *)&local_90,100);
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateLocalAccessChainConvertPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateLocalSingleBlockLoadStoreElimPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateLocalSingleStoreElimPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateSimplificationPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateAggressiveDCEPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateVectorDCEPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateDeadInsertElimPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateAggressiveDCEPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateDeadBranchElimPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateBlockMergePass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateLocalMultiStoreElimPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateIfConversionPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateSimplificationPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateAggressiveDCEPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateVectorDCEPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateDeadInsertElimPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateInterpolateFixupPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  if (options->optimizeSize == true) {
    spvtools::CreateRedundancyEliminationPass();
    spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
    spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
    spvtools::CreateEliminateDeadInputComponentsSafePass();
    spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
    spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  }
  spvtools::CreateAggressiveDCEPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  spvtools::CreateCFGCleanupPass();
  spvtools::Optimizer::RegisterPass(&local_88,(PassToken *)&local_90);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&local_90);
  options_00 = spvOptimizerOptionsCreate();
  if (options->optimizerAllowExpandedIDBound == true) {
    spvOptimizerOptionsSetMaxIdBound(options_00,0x3fffffff);
  }
  env = MapToSpirvToolsEnv(&intermediate->spvVersion,logger);
  spvtools::Optimizer::SetTargetEnv(&local_88,env);
  spvOptimizerOptionsSetRunValidator(options_00,false);
  puVar1 = (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  spvtools::Optimizer::Run
            (&local_88,puVar1,
             (long)(spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1 >> 2,spirv,options_00);
  if (((options->optimizerAllowExpandedIDBound == true) &&
      (puVar2 = (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,
      0xc < (ulong)((long)(spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar2))) &&
     (0x3fffff < puVar2[3])) {
    spvtools::Optimizer::Optimizer(&local_90,local_7c);
    local_70.super__Function_base._M_functor._8_8_ = 0;
    local_70.super__Function_base._M_functor._M_unused._M_object = OptimizerMesssageConsumer;
    local_70._M_invoker =
         std::
         _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
         ::_M_invoke;
    local_70.super__Function_base._M_manager =
         std::
         _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
         ::_M_manager;
    spvtools::Optimizer::SetMessageConsumer(&local_90,&local_70);
    if (local_70.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_70.super__Function_base._M_manager)
                ((_Any_data *)&local_70,(_Any_data *)&local_70,__destroy_functor);
    }
    spvtools::CreateCompactIdsPass();
    spvtools::Optimizer::RegisterPass(&local_90,&local_78);
    spvtools::Optimizer::PassToken::~PassToken(&local_78);
    puVar1 = (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    spvtools::Optimizer::Run
              (&local_90,puVar1,
               (long)(spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2,spirv,options_00)
    ;
    spvtools::Optimizer::~Optimizer(&local_90);
  }
  spvOptimizerOptionsDestroy(options_00);
  spvtools::Optimizer::~Optimizer(&local_88);
  return;
}

Assistant:

void SpirvToolsTransform(const glslang::TIntermediate& intermediate, std::vector<unsigned int>& spirv,
                         spv::SpvBuildLogger* logger, const SpvOptions* options)
{
    spv_target_env target_env = MapToSpirvToolsEnv(intermediate.getSpv(), logger);

    spvtools::Optimizer optimizer(target_env);
    optimizer.SetMessageConsumer(OptimizerMesssageConsumer);

    // If debug (specifically source line info) is being generated, propagate
    // line information into all SPIR-V instructions. This avoids loss of
    // information when instructions are deleted or moved. Later, remove
    // redundant information to minimize final SPRIR-V size.
    if (options->stripDebugInfo) {
        optimizer.RegisterPass(spvtools::CreateStripDebugInfoPass());
    }
    optimizer.RegisterPass(spvtools::CreateWrapOpKillPass());
    optimizer.RegisterPass(spvtools::CreateDeadBranchElimPass());
    optimizer.RegisterPass(spvtools::CreateMergeReturnPass());
    optimizer.RegisterPass(spvtools::CreateInlineExhaustivePass());
    optimizer.RegisterPass(spvtools::CreateEliminateDeadFunctionsPass());
    optimizer.RegisterPass(spvtools::CreateScalarReplacementPass());
    optimizer.RegisterPass(spvtools::CreateLocalAccessChainConvertPass());
    optimizer.RegisterPass(spvtools::CreateLocalSingleBlockLoadStoreElimPass());
    optimizer.RegisterPass(spvtools::CreateLocalSingleStoreElimPass());
    optimizer.RegisterPass(spvtools::CreateSimplificationPass());
    optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass());
    optimizer.RegisterPass(spvtools::CreateVectorDCEPass());
    optimizer.RegisterPass(spvtools::CreateDeadInsertElimPass());
    optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass());
    optimizer.RegisterPass(spvtools::CreateDeadBranchElimPass());
    optimizer.RegisterPass(spvtools::CreateBlockMergePass());
    optimizer.RegisterPass(spvtools::CreateLocalMultiStoreElimPass());
    optimizer.RegisterPass(spvtools::CreateIfConversionPass());
    optimizer.RegisterPass(spvtools::CreateSimplificationPass());
    optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass());
    optimizer.RegisterPass(spvtools::CreateVectorDCEPass());
    optimizer.RegisterPass(spvtools::CreateDeadInsertElimPass());
    optimizer.RegisterPass(spvtools::CreateInterpolateFixupPass());
    if (options->optimizeSize) {
        optimizer.RegisterPass(spvtools::CreateRedundancyEliminationPass());
        optimizer.RegisterPass(spvtools::CreateEliminateDeadInputComponentsSafePass());
    }
    optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass());
    optimizer.RegisterPass(spvtools::CreateCFGCleanupPass());

    spvtools::OptimizerOptions spvOptOptions;
    if (options->optimizerAllowExpandedIDBound)
        spvOptOptions.set_max_id_bound(0x3FFFFFFF);
    optimizer.SetTargetEnv(MapToSpirvToolsEnv(intermediate.getSpv(), logger));
    spvOptOptions.set_run_validator(false); // The validator may run as a separate step later on
    optimizer.Run(spirv.data(), spirv.size(), &spirv, spvOptOptions);

    if (options->optimizerAllowExpandedIDBound) {
        if (spirv.size() > 3 && spirv[3] > kDefaultMaxIdBound) {
            spvtools::Optimizer optimizer2(target_env);
            optimizer2.SetMessageConsumer(OptimizerMesssageConsumer);
            optimizer2.RegisterPass(spvtools::CreateCompactIdsPass());
            optimizer2.Run(spirv.data(), spirv.size(), &spirv, spvOptOptions);
        }
    }
}